

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

function<void_(TcpSocket_*)> * __thiscall
TcpSocketImpl::BindFuncBytesReceived
          (function<void_(TcpSocket_*)> *__return_storage_ptr__,TcpSocketImpl *this,
          function<void_(TcpSocket_*)> *fBytesReceived)

{
  std::function<void_(TcpSocket_*)>::swap(&this->m_fBytesReceived,fBytesReceived);
  std::function<void_(TcpSocket_*)>::function(__return_storage_ptr__,fBytesReceived);
  return __return_storage_ptr__;
}

Assistant:

function<void(TcpSocket*)> TcpSocketImpl::BindFuncBytesReceived(function<void(TcpSocket*)> fBytesReceived) noexcept
{
    m_fBytesReceived.swap(fBytesReceived);
    return fBytesReceived;
}